

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesFrequencySetRange(zes_freq_handle_t hFrequency,zes_freq_range_t *pLimits)

{
  zes_pfnFrequencySetRange_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFrequencySetRange_t pfnSetRange;
  zes_freq_range_t *pLimits_local;
  zes_freq_handle_t hFrequency_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Frequency).pfnSetRange;
    if (p_Var1 == (zes_pfnFrequencySetRange_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFrequency_local._4_4_ = (*p_Var1)(hFrequency,pLimits);
    }
  }
  else {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFrequency_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFrequencySetRange(
    zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
    const zes_freq_range_t* pLimits                 ///< [in] The limits between which the hardware can operate for the
                                                    ///< specified domain.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFrequencySetRange_t pfnSetRange = [&result] {
        auto pfnSetRange = ze_lib::context->zesDdiTable.load()->Frequency.pfnSetRange;
        if( nullptr == pfnSetRange ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetRange;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetRange( hFrequency, pLimits );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetRange = ze_lib::context->zesDdiTable.load()->Frequency.pfnSetRange;
    if( nullptr == pfnSetRange ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetRange( hFrequency, pLimits );
    #endif
}